

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashsearch2.h
# Opt level: O3

string * hashStr2(string *__return_storage_ptr__,string *param_1,uint16_t seed,size_t n1,size_t n2,
                 string *default_value,string *map_name,string *key_type,bool nonKeyLookups)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  long lVar3;
  char cVar4;
  long *plVar5;
  undefined8 *puVar6;
  ulong *puVar7;
  size_t sVar8;
  size_type *psVar9;
  long *plVar10;
  char cVar11;
  ulong uVar12;
  undefined8 uVar13;
  ulong uVar14;
  uint __val;
  uint __len;
  string __str_2;
  string __str_1;
  string __str;
  long *local_1b8;
  undefined8 local_1b0;
  long local_1a8;
  undefined8 uStack_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  ulong *local_178;
  long local_170;
  ulong local_168;
  long lStack_160;
  ulong *local_158;
  long local_150;
  ulong local_148;
  long lStack_140;
  long *local_138;
  undefined8 local_130;
  long local_128;
  undefined8 uStack_120;
  long *local_118;
  undefined8 local_110;
  long local_108;
  undefined8 uStack_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_f8;
  ulong *local_f0;
  uint local_e8;
  undefined4 uStack_e4;
  ulong local_e0 [2];
  ulong *local_d0;
  uint local_c8;
  undefined4 uStack_c4;
  ulong local_c0 [2];
  ulong *local_b0;
  long local_a8;
  ulong local_a0 [2];
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::operator+(&local_50,
                 "    static inline uint32_t hash(const std::string& key, const uint32_t& coeff) noexcept{\n        uint32_t h = 0;\n\n        for(size_t i = 0; i < key.size(); i++)\n            h = h*coeff + key[i];\n\n        return h;\n    }\n};\n\nstd::string_view "
                 ,map_name);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_90 = &local_80;
  plVar10 = plVar5 + 2;
  if ((long *)*plVar5 == plVar10) {
    local_80 = *plVar10;
    lStack_78 = plVar5[3];
  }
  else {
    local_80 = *plVar10;
    local_90 = (long *)*plVar5;
  }
  local_88 = plVar5[1];
  *plVar5 = (long)plVar10;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_90,(ulong)(key_type->_M_dataplus)._M_p);
  local_70 = &local_60;
  plVar10 = plVar5 + 2;
  if ((long *)*plVar5 == plVar10) {
    local_60 = *plVar10;
    lStack_58 = plVar5[3];
  }
  else {
    local_60 = *plVar10;
    local_70 = (long *)*plVar5;
  }
  local_68 = plVar5[1];
  *plVar5 = (long)plVar10;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_70);
  local_178 = &local_168;
  puVar7 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar7) {
    local_168 = *puVar7;
    lStack_160 = plVar5[3];
  }
  else {
    local_168 = *puVar7;
    local_178 = (ulong *)*plVar5;
  }
  local_170 = plVar5[1];
  *plVar5 = (long)puVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  __val = (uint)seed;
  __len = 1;
  if (((9 < seed) && (__len = 2, 99 < seed)) && (__len = 3, 999 < __val)) {
    __len = 5 - (__val < 10000);
  }
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct((ulong)&local_b0,(char)__len);
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_b0,__len,__val);
  uVar12 = 0xf;
  if (local_178 != &local_168) {
    uVar12 = local_168;
  }
  if (uVar12 < (ulong)(local_a8 + local_170)) {
    uVar12 = 0xf;
    if (local_b0 != local_a0) {
      uVar12 = local_a0[0];
    }
    if (uVar12 < (ulong)(local_a8 + local_170)) goto LAB_00108221;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_178);
  }
  else {
LAB_00108221:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_178,(ulong)local_b0);
  }
  local_138 = &local_128;
  plVar5 = puVar6 + 2;
  if ((long *)*puVar6 == plVar5) {
    local_128 = *plVar5;
    uStack_120 = puVar6[3];
  }
  else {
    local_128 = *plVar5;
    local_138 = (long *)*puVar6;
  }
  local_130 = puVar6[1];
  *puVar6 = plVar5;
  puVar6[1] = 0;
  *(undefined1 *)plVar5 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_138);
  puVar7 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar7) {
    local_148 = *puVar7;
    lStack_140 = plVar5[3];
    local_158 = &local_148;
  }
  else {
    local_148 = *puVar7;
    local_158 = (ulong *)*plVar5;
  }
  local_150 = plVar5[1];
  *plVar5 = (long)puVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  cVar11 = '\x01';
  if (9 < n1) {
    sVar8 = n1;
    cVar4 = '\x04';
    do {
      cVar11 = cVar4;
      if (sVar8 < 100) {
        cVar11 = cVar11 + -2;
        goto LAB_0010834b;
      }
      if (sVar8 < 1000) {
        cVar11 = cVar11 + -1;
        goto LAB_0010834b;
      }
      if (sVar8 < 10000) goto LAB_0010834b;
      bVar2 = 99999 < sVar8;
      sVar8 = sVar8 / 10000;
      cVar4 = cVar11 + '\x04';
    } while (bVar2);
    cVar11 = cVar11 + '\x01';
  }
LAB_0010834b:
  local_d0 = local_c0;
  std::__cxx11::string::_M_construct((ulong)&local_d0,cVar11);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_d0,local_c8,n1);
  uVar12 = CONCAT44(uStack_c4,local_c8) + local_150;
  uVar14 = 0xf;
  if (local_158 != &local_148) {
    uVar14 = local_148;
  }
  if (uVar14 < uVar12) {
    uVar14 = 0xf;
    if (local_d0 != local_c0) {
      uVar14 = local_c0[0];
    }
    if (uVar14 < uVar12) goto LAB_001083cb;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_158);
  }
  else {
LAB_001083cb:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_158,(ulong)local_d0);
  }
  local_118 = &local_108;
  plVar5 = puVar6 + 2;
  if ((long *)*puVar6 == plVar5) {
    local_108 = *plVar5;
    uStack_100 = puVar6[3];
  }
  else {
    local_108 = *plVar5;
    local_118 = (long *)*puVar6;
  }
  local_110 = puVar6[1];
  *puVar6 = plVar5;
  puVar6[1] = 0;
  *(undefined1 *)plVar5 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_118);
  paVar1 = &local_198.field_2;
  puVar7 = (ulong *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar7) {
    local_198.field_2._M_allocated_capacity = *puVar7;
    local_198.field_2._8_8_ = plVar5[3];
    local_198._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_198.field_2._M_allocated_capacity = *puVar7;
    local_198._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_198._M_string_length = plVar5[1];
  *plVar5 = (long)puVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  cVar11 = '\x01';
  if (9 < n2) {
    sVar8 = n2;
    cVar4 = '\x04';
    do {
      cVar11 = cVar4;
      if (sVar8 < 100) {
        cVar11 = cVar11 + -2;
        goto LAB_001084f1;
      }
      if (sVar8 < 1000) {
        cVar11 = cVar11 + -1;
        goto LAB_001084f1;
      }
      if (sVar8 < 10000) goto LAB_001084f1;
      bVar2 = 99999 < sVar8;
      sVar8 = sVar8 / 10000;
      cVar4 = cVar11 + '\x04';
    } while (bVar2);
    cVar11 = cVar11 + '\x01';
  }
LAB_001084f1:
  local_f0 = local_e0;
  std::__cxx11::string::_M_construct((ulong)&local_f0,cVar11);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_f0,local_e8,n2);
  uVar12 = CONCAT44(uStack_e4,local_e8) + local_198._M_string_length;
  uVar13 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != paVar1) {
    uVar13 = local_198.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar13 < uVar12) {
    uVar14 = 0xf;
    if (local_f0 != local_e0) {
      uVar14 = local_e0[0];
    }
    if (uVar12 <= uVar14) {
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_f0,0,(char *)0x0,(ulong)local_198._M_dataplus._M_p);
      goto LAB_0010858b;
    }
  }
  puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_198,(ulong)local_f0);
LAB_0010858b:
  local_1b8 = &local_1a8;
  plVar5 = puVar6 + 2;
  if ((long *)*puVar6 == plVar5) {
    local_1a8 = *plVar5;
    uStack_1a0 = puVar6[3];
  }
  else {
    local_1a8 = *plVar5;
    local_1b8 = (long *)*puVar6;
  }
  local_1b0 = puVar6[1];
  *puVar6 = plVar5;
  puVar6[1] = 0;
  *(undefined1 *)plVar5 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_1b8);
  local_f8 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_f8;
  psVar9 = (size_type *)(plVar5 + 2);
  if ((size_type *)*plVar5 == psVar9) {
    lVar3 = plVar5[3];
    local_f8->_M_allocated_capacity = *psVar9;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar5;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
  }
  __return_storage_ptr__->_M_string_length = plVar5[1];
  *plVar5 = (long)psVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if (local_1b8 != &local_1a8) {
    operator_delete(local_1b8,local_1a8 + 1);
  }
  if (local_f0 != local_e0) {
    operator_delete(local_f0,local_e0[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != paVar1) {
    operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
  }
  if (local_118 != &local_108) {
    operator_delete(local_118,local_108 + 1);
  }
  if (local_d0 != local_c0) {
    operator_delete(local_d0,local_c0[0] + 1);
  }
  if (local_158 != &local_148) {
    operator_delete(local_158,local_148 + 1);
  }
  if (local_138 != &local_128) {
    operator_delete(local_138,local_128 + 1);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0,local_a0[0] + 1);
  }
  if (local_178 != &local_168) {
    operator_delete(local_178,local_168 + 1);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (nonKeyLookups) {
    std::operator+(&local_198,
                   "    return checkBin(key, bin) ? std::string_view(&flat_vals[val_start[bin]], val_size[bin]) : \""
                   ,default_value);
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_198);
    plVar5 = puVar6 + 2;
    if ((long *)*puVar6 == plVar5) {
      local_1a8 = *plVar5;
      uStack_1a0 = puVar6[3];
      local_1b8 = &local_1a8;
    }
    else {
      local_1a8 = *plVar5;
      local_1b8 = (long *)*puVar6;
    }
    local_1b0 = puVar6[1];
    *puVar6 = plVar5;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_1b8);
    if (local_1b8 != &local_1a8) {
      operator_delete(local_1b8,local_1a8 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != paVar1) {
      operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string hashStr2(const std::string&, uint16_t seed, size_t n1, size_t n2, const std::string& default_value, std::string map_name, std::string key_type, bool nonKeyLookups){
    std::string hash =
        "    static inline uint32_t hash(const std::string& key, const uint32_t& coeff) noexcept{\n"
        "        uint32_t h = 0;\n"
        "\n"
        "        for(size_t i = 0; i < key.size(); i++)\n"
        "            h = h*coeff + key[i];\n"
        "\n"
        "        return h;\n"
        "    }\n"
        "};\n"
        "\n"
        "std::string_view " + map_name + "::lookup(const " + key_type + "& key) noexcept{\n"
        "    constexpr uint32_t s0 = " + std::to_string(seed) + ";\n"
        "    const size_t h1 = hash(key, s0) & " + std::to_string(n1) + ";\n"
        "    const uint32_t& s1 = seeds[h1];\n"
        "    const size_t bin = hash(key, s1) & " + std::to_string(n2) + ";\n";
    if(nonKeyLookups) hash +=
        "    return checkBin(key, bin) ? std::string_view(&flat_vals[val_start[bin]], val_size[bin]) : \"" + default_value + "\";\n";
    else hash +=
        "    #ifndef NDEBUG\n"
        "    assert(checkBin(key, bin));\n"
        "    #endif\n\n"
        "    return std::string_view(&flat_vals[val_start[bin]], val_size[bin]);\n";

    hash += "}\n\n";

    return hash;
}